

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

int64_t __thiscall leveldb::VersionSet::MaxNextLevelOverlappingBytes(VersionSet *this)

{
  long lVar1;
  Version *this_00;
  pointer ppFVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  pointer ppFVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_48;
  
  local_48.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->current_;
  ppFVar6 = (pointer)0x0;
  lVar9 = 0;
  lVar7 = 1;
  do {
    ppFVar2 = this_00->files_[lVar7].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar8 = lVar7 + 1;
    if (this_00->files_[lVar7].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
      uVar5 = 0;
      do {
        Version::GetOverlappingInputs
                  (this_00,(int)lVar8,&ppFVar2[uVar5]->smallest,&ppFVar2[uVar5]->largest,&local_48);
        if ((long)local_48.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0) {
          lVar3 = 0;
        }
        else {
          lVar1 = (long)local_48.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
          lVar4 = 0;
          lVar3 = 0;
          do {
            lVar3 = lVar3 + local_48.
                            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar4]->file_size;
            lVar4 = lVar4 + 1;
          } while (lVar1 + (ulong)(lVar1 == 0) != lVar4);
        }
        if (lVar9 < lVar3) {
          lVar9 = lVar3;
        }
        uVar5 = uVar5 + 1;
        this_00 = this->current_;
        ppFVar2 = this_00->files_[lVar7].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppFVar6 = local_48.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)this_00->files_[lVar7].
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3
                              ));
    }
    lVar7 = lVar8;
  } while (lVar8 != 6);
  if (ppFVar6 != (pointer)0x0) {
    operator_delete(ppFVar6);
  }
  return lVar9;
}

Assistant:

int64_t VersionSet::MaxNextLevelOverlappingBytes() {
  int64_t result = 0;
  std::vector<FileMetaData*> overlaps;
  for (int level = 1; level < config::kNumLevels - 1; level++) {
    for (size_t i = 0; i < current_->files_[level].size(); i++) {
      const FileMetaData* f = current_->files_[level][i];
      current_->GetOverlappingInputs(level + 1, &f->smallest, &f->largest,
                                     &overlaps);
      const int64_t sum = TotalFileSize(overlaps);
      if (sum > result) {
        result = sum;
      }
    }
  }
  return result;
}